

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_dp.c
# Opt level: O3

void gdFreeDynamicCtx(gdIOCtx *ctx)

{
  _func_int_gdIOCtx_ptr *ptr;
  
  ptr = ctx[1].getC;
  gdFree(ctx);
  if ((*(void **)ptr != (void *)0x0) && (*(int *)(ptr + 0x18) != 0)) {
    gdFree(*(void **)ptr);
    *(undefined8 *)ptr = 0;
  }
  *(undefined8 *)(ptr + 8) = 0;
  gdFree(ptr);
  return;
}

Assistant:

static void gdFreeDynamicCtx(struct gdIOCtx *ctx)
{
	dynamicPtr *dp;
	dpIOCtx *dctx;

	dctx = (dpIOCtx *)ctx;
	dp = dctx->dp;

	gdFree(ctx);

	/* clean up the data block and return it */
	/* 2.0.21: never free memory we don't own */
	if((dp->data != NULL) && (dp->freeOK)) {
		gdFree(dp->data);
		dp->data = NULL;
	}

	dp->realSize = 0;
	dp->logicalSize = 0;

	gdFree(dp);
}